

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmTargets *this_00;
  pointer *pppcVar1;
  cmake *pcVar2;
  iterator __position;
  undefined *puVar3;
  bool bVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  mapped_type *pmVar7;
  pointer ppcVar8;
  ostream *poVar9;
  pointer ppcVar10;
  ulong uVar11;
  ulong uVar12;
  undefined **ppuVar13;
  __node_base _Var14;
  string f;
  cmMakefile *dirMf;
  char num [100];
  Snapshot snapshot;
  cmTargets globalTargets;
  ostringstream msg;
  allocator local_291;
  long *local_290;
  long local_288;
  long local_280 [2];
  cmMakefile *local_270;
  string local_268 [3];
  Snapshot local_1f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  undefined1 local_1a8 [16];
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> local_198 [2];
  ios_base local_138 [264];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar2 = this->CMakeInstance;
  local_1f8.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_1f8.State = (pcVar2->CurrentSnapshot).State;
  local_1f8.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmState::Snapshot::GetDirectory((Directory *)local_1a8,&local_1f8);
  pcVar5 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_268,pcVar5,(allocator *)&local_1e0);
  cmState::Directory::SetCurrentSource((Directory *)local_1a8,local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
    operator_delete(local_268[0]._M_dataplus._M_p,local_268[0].field_2._M_allocated_capacity + 1);
  }
  cmState::Snapshot::GetDirectory((Directory *)local_1a8,&local_1f8);
  pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_268,pcVar5,(allocator *)&local_1e0);
  cmState::Directory::SetCurrentBinary((Directory *)local_1a8,local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
    operator_delete(local_268[0]._M_dataplus._M_p,local_268[0].field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile(pcVar6,this,&local_1f8);
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_270 = pcVar6;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_270);
  }
  else {
    *__position._M_current = pcVar6;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_1a8,pcVar5,(allocator *)local_268);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)local_198[0].Data.
                                  super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_270);
  cmMakefile::EnforceDirectoryLevelRules(local_270);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_1e0._M_buckets = &local_1e0._M_single_bucket;
  local_1e0._M_bucket_count = 1;
  local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1e0._M_element_count = 0;
  local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1e0._M_rehash_policy._M_next_resize = 0;
  local_1e0._M_single_bucket = (__node_base_ptr)0x0;
  CreateDefaultGlobalTargets(this,(cmTargets *)&local_1e0);
  ppcVar8 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar10 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar10 == ppcVar8) {
    uVar11 = 0;
  }
  else {
    uVar12 = 0;
    do {
      if (local_1e0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        pcVar6 = ppcVar8[uVar12];
        this_00 = &pcVar6->Targets;
        _Var14._M_nxt = local_1e0._M_before_begin._M_nxt;
        do {
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,(key_type *)(_Var14._M_nxt + 1));
          cmTarget::operator=(pmVar7,(cmTarget *)(_Var14._M_nxt + 5));
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,(key_type *)(_Var14._M_nxt + 1));
          cmTarget::SetMakefile(pmVar7,pcVar6);
          _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
        } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
        ppcVar8 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar10 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      uVar11 = (long)ppcVar10 - (long)ppcVar8 >> 3;
    } while (uVar12 < uVar11);
  }
  sprintf((char *)local_268,"%d",uVar11);
  pcVar2 = this->CMakeInstance;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_NUMBER_OF_MAKEFILES","");
  cmake::AddCacheEntry(pcVar2,(string *)local_1a8,(char *)local_268,"number of local generators",4);
  if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)local_198[0].Data.
                                  super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Configuring incomplete, errors occurred!",0x28);
      ppuVar13 = &PTR_anon_var_dwarf_32c4c3_005cc748;
      do {
        pcVar5 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&local_290,pcVar5,&local_291);
        std::__cxx11::string::append((char *)&local_290);
        std::__cxx11::string::append((char *)&local_290);
        std::__cxx11::string::append((char *)&local_290);
        bVar4 = cmsys::SystemTools::FileExists((char *)local_290);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\nSee also \"",0xb);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_290,local_288);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".",2);
        }
        if (local_290 != local_280) {
          operator_delete(local_290,local_280[0] + 1);
        }
        puVar3 = *ppuVar13;
        ppuVar13 = ppuVar13 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Configuring done",0x10);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,(char *)local_290,-1.0);
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e0);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmState::Snapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource
    (this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary
    (this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  this->Makefiles.push_back(dirMf);

  this->BinaryDirectories.insert(
      this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  cmTargets globalTargets;
  this->CreateDefaultGlobalTargets(&globalTargets);

  for (unsigned int i = 0; i < this->Makefiles.size(); ++i)
    {
    cmMakefile* mf = this->Makefiles[i];
    cmTargets* targets = &(mf->GetTargets());
    cmTargets::iterator tit;
    for ( tit = globalTargets.begin(); tit != globalTargets.end(); ++ tit )
      {
      (*targets)[tit->first] = tit->second;
      (*targets)[tit->first].SetMakefile(mf);
      }
    }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num,"%d",static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry
    ("CMAKE_NUMBER_OF_MAKEFILES", num,
     "number of local generators", cmState::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if ( this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE)
    {
    std::ostringstream msg;
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = {"CMakeOutput.log", "CMakeError.log", 0};
      for(const char** log = logs; *log; ++log)
        {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if(cmSystemTools::FileExists(f.c_str()))
          {
          msg << "\nSee also \"" << f << "\".";
          }
        }
      }
    else
      {
      msg << "Configuring done";
      }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
    }
}